

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void ndiLogState(ndicapi *pol,char *outInformation)

{
  char *__dest;
  ostream *poVar1;
  ulong uVar2;
  char *__src;
  size_t __n;
  string local_288 [32];
  string local_268 [32];
  string local_248 [36];
  int local_224;
  int local_220;
  int i_27;
  int j;
  int i_26;
  int i_25;
  int i_24;
  int i_23;
  int i_22;
  int i_21;
  int i_20;
  int i_19;
  int i_18;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int local_1a4;
  stringstream local_1a0 [4];
  int i;
  stringstream ss;
  ostream local_190 [376];
  char *local_18;
  char *outInformation_local;
  ndicapi *pol_local;
  
  local_18 = outInformation;
  outInformation_local = (char *)pol;
  std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1a4 = 0; local_1a4 < 3; local_1a4 = local_1a4 + 1) {
    poVar1 = std::operator<<(local_190,"GxTransforms[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1a4);
    poVar1 = std::operator<<(poVar1,"][52]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)local_1a4 * 0x34 + 0xa0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_190,"GxStatus[8]: ");
  std::operator<<(poVar1,outInformation_local + 0x13c);
  for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
    poVar1 = std::operator<<(local_190,"GxInformation[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_3);
    poVar1 = std::operator<<(poVar1,"][12]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_3 * 0xc + 0x144);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_4 = 0; i_4 < 3; i_4 = i_4 + 1) {
    poVar1 = std::operator<<(local_190,"GxSingleStray[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_4);
    poVar1 = std::operator<<(poVar1,"][24]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_4 * 0x18 + 0x168);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_5 = 0; i_5 < 3; i_5 = i_5 + 1) {
    poVar1 = std::operator<<(local_190,"GxFrame[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_5);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_5 * 8 + 0x1b0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_6 = 0; i_6 < 9; i_6 = i_6 + 1) {
    poVar1 = std::operator<<(local_190,"GxPassiveTransforms[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_6);
    poVar1 = std::operator<<(poVar1,"][52]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_6 * 0x34 + 0x1c8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_190,"GxPassiveStatus[24]: ");
  std::operator<<(poVar1,outInformation_local + 0x39c);
  for (i_7 = 0; i_7 < 9; i_7 = i_7 + 1) {
    poVar1 = std::operator<<(local_190,"GxPassiveInformation[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_7);
    poVar1 = std::operator<<(poVar1,"][12]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_7 * 0xc + 0x3b4);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_8 = 0; i_8 < 9; i_8 = i_8 + 1) {
    poVar1 = std::operator<<(local_190,"GxPassiveFrame[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_8);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_8 * 8 + 0x420);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_190,"GxPassiveStray[424]: ");
  std::operator<<(poVar1,outInformation_local + 0x468);
  for (i_9 = 0; i_9 < 3; i_9 = i_9 + 1) {
    poVar1 = std::operator<<(local_190,"PstatBasic[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_9);
    poVar1 = std::operator<<(poVar1,"][32]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_9 * 0x20 + 0x610);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_10 = 0; i_10 < 3; i_10 = i_10 + 1) {
    poVar1 = std::operator<<(local_190,"PstatTesting[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_10);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_10 * 8 + 0x670);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_11 = 0; i_11 < 3; i_11 = i_11 + 1) {
    poVar1 = std::operator<<(local_190,"PstatPartNumber[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_11);
    poVar1 = std::operator<<(poVar1,"][20]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_11 * 0x14 + 0x688);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_12 = 0; i_12 < 3; i_12 = i_12 + 1) {
    poVar1 = std::operator<<(local_190,"PstatAccessories[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_12);
    poVar1 = std::operator<<(poVar1,"][2]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_12 * 2 + 0x6c4);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_13 = 0; i_13 < 3; i_13 = i_13 + 1) {
    poVar1 = std::operator<<(local_190,"PstatMarkerType[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_13);
    poVar1 = std::operator<<(poVar1,"][2]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_13 * 2 + 0x6ca);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_14 = 0; i_14 < 9; i_14 = i_14 + 1) {
    poVar1 = std::operator<<(local_190,"PstatPassiveBasic[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_14);
    poVar1 = std::operator<<(poVar1,"][32]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_14 * 0x20 + 0x6d0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_15 = 0; i_15 < 9; i_15 = i_15 + 1) {
    poVar1 = std::operator<<(local_190,"PstatPassiveTesting[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_15);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_15 * 8 + 0x7f0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_16 = 0; i_16 < 9; i_16 = i_16 + 1) {
    poVar1 = std::operator<<(local_190,"PstatPassivePartNumber[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_16);
    poVar1 = std::operator<<(poVar1,"][20]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_16 * 0x14 + 0x838);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_17 = 0; i_17 < 9; i_17 = i_17 + 1) {
    poVar1 = std::operator<<(local_190,"PstatPassiveAccessories[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_17);
    poVar1 = std::operator<<(poVar1,"][2]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_17 * 2 + 0x8ec);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_18 = 0; i_18 < 9; i_18 = i_18 + 1) {
    poVar1 = std::operator<<(local_190,"PstatPassiveMarkerType[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_18);
    poVar1 = std::operator<<(poVar1,"][2]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_18 * 2 + 0x8fe);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_190,"SstatControl[2]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x910);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"SstatSensor[2]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x912);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"SstatTiu[2]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x914);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"IrchkDetected: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(outInformation_local + 0x918));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"IrchkSources[128]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x91c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhrqReply[2]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x99c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhsrReply[1284]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x99e);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhinfUnoccupied: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(outInformation_local + 0xea4));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhinfBasic[34]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0xea8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhinfTesting[8]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0xeca);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhinfPartNumber[20]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0xed2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhinfAccessories[2]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0xee6);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhinfMarkerType[2]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0xee8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhinfPortLocation[14]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0xeea);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"PhinfGpioStatus[2]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0xef8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"TxHandleCount: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(outInformation_local + 0xefc));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"TxHandles[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,(uchar *)(outInformation_local + 0xf00));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (i_19 = 0; i_19 < *(int *)(outInformation_local + 0xefc); i_19 = i_19 + 1) {
    poVar1 = std::operator<<(local_190,"TxTransforms[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_19);
    poVar1 = std::operator<<(poVar1,"][52]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_19 * 0x34 + 0xf18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_20 = 0; i_20 < *(int *)(outInformation_local + 0xefc); i_20 = i_20 + 1) {
    poVar1 = std::operator<<(local_190,"TxStatus[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_20);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_20 * 8 + 0x13f8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_21 = 0; i_21 < *(int *)(outInformation_local + 0xefc); i_21 = i_21 + 1) {
    poVar1 = std::operator<<(local_190,"TxFrame[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_21);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_21 * 8 + 0x14b8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_22 = 0; i_22 < *(int *)(outInformation_local + 0xefc); i_22 = i_22 + 1) {
    poVar1 = std::operator<<(local_190,"TxInformation[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_22);
    poVar1 = std::operator<<(poVar1,"][12]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_22 * 0xc + 0x1578);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_23 = 0; i_23 < *(int *)(outInformation_local + 0xefc); i_23 = i_23 + 1) {
    poVar1 = std::operator<<(local_190,"TxSingleStray[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_23);
    poVar1 = std::operator<<(poVar1,"][24]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_23 * 0x18 + 0x1698);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_190,"TxSystemStatus[4]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x18d8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"TxPassiveStrayCount: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(outInformation_local + 0x18dc));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"TxPassiveStrayOov[14]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x18e0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"TxPassiveStray[1052]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x18ee);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"BxHandleCount: ");
  poVar1 = std::operator<<(poVar1,outInformation_local[0x1d0c]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"BxHandles[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x1d0d);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"BxHandlesStatus[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x1d25);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"BxFrameNumber[NDI_MAX_HANDLES]: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,outInformation_local + 0x1d40);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (i_24 = 0; i_24 < (int)(uint)(byte)outInformation_local[0x1d0c]; i_24 = i_24 + 1) {
    poVar1 = std::operator<<(local_190,"BxTransforms[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_24);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,outInformation_local + (long)i_24 * 0x20 + 0x1da0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_190,"BxPortStatus[NDI_MAX_HANDLES]: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,outInformation_local + 0x20a0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (i_25 = 0; i_25 < (int)(uint)(byte)outInformation_local[0x1d0c]; i_25 = i_25 + 1) {
    poVar1 = std::operator<<(local_190,"BxToolMarkerInformation[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_25);
    poVar1 = std::operator<<(poVar1,"][11]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)i_25 * 0xb + 0x2100);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_190,"BxActiveSingleStrayMarkerStatus[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x2208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (i_26 = 0; i_26 < (int)(uint)(byte)outInformation_local[0x1d0c]; i_26 = i_26 + 1) {
    poVar1 = std::operator<<(local_190,"BxActiveSingleStrayMarkerPosition[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_26);
    poVar1 = std::operator<<(poVar1,"][3]: ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,outInformation_local + (long)i_26 * 0xc + 0x2220);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(local_190,"Bx3DMarkerCount[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x2340);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (j = 0; j < (int)(uint)(byte)outInformation_local[0x1d0c]; j = j + 1) {
    poVar1 = std::operator<<(local_190,"Bx3DMarkerOutOfVolume[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,j);
    poVar1 = std::operator<<(poVar1,"][3]: ");
    poVar1 = std::operator<<(poVar1,outInformation_local + (long)j * 3 + 0x2358);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (i_27 = 0; i_27 < (int)(uint)(byte)outInformation_local[0x1d0c]; i_27 = i_27 + 1) {
    for (local_220 = 0; local_220 < outInformation_local[(long)i_27 + 0x2340];
        local_220 = local_220 + 1) {
      poVar1 = std::operator<<(local_190,"Bx3DMarkerPosition[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_27);
      poVar1 = std::operator<<(poVar1,"][");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_220);
      poVar1 = std::operator<<(poVar1,"][3]: ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,outInformation_local +
                                 (long)local_220 * 0xc + (long)i_27 * 0xf0 + 0x23a0);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar1 = std::operator<<(local_190,"BxPassiveStrayCount: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(outInformation_local + 0x3a20));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_190,"BxPassiveStrayOutOfVolume[30]: ");
  poVar1 = std::operator<<(poVar1,outInformation_local + 0x3a24);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_224 = 0; local_224 < *(int *)(outInformation_local + 0x3a20); local_224 = local_224 + 1
      ) {
    poVar1 = std::operator<<(local_190,"BxPassiveStrayPosition[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_224);
    poVar1 = std::operator<<(poVar1,"][3]: ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,outInformation_local + (long)local_224 * 0xc + 0x3a44);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < 0xffff) {
    std::__cxx11::string::~string(local_248);
    __dest = local_18;
    std::__cxx11::stringstream::str();
    __src = (char *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    __n = std::__cxx11::string::size();
    strncpy(__dest,__src,__n);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    return;
  }
  __assert_fail("ss.str().size() < USHRT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/qiaotian[P]ndicapi/ndicapi.cxx"
                ,0xef,"void ndiLogState(ndicapi *, char *)");
}

Assistant:

ndicapiExport void ndiLogState(ndicapi* pol, char outInformation[USHRT_MAX])
{
#ifdef __cplusplus
  std::stringstream ss;
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxTransforms[" << i << "][52]: " << pol->GxTransforms[i] << std::endl;
  }
  ss << "GxStatus[8]: " << pol->GxStatus;
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxInformation[" << i << "][12]: " << pol->GxInformation[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxSingleStray[" << i << "][24]: " << pol->GxSingleStray[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxFrame[" << i << "][8]: " << pol->GxFrame[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveTransforms[" << i << "][52]: " << pol->GxPassiveTransforms[i] << std::endl;
  }
  ss << "GxPassiveStatus[24]: " << pol->GxPassiveStatus;
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveInformation[" << i << "][12]: " << pol->GxPassiveInformation[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveFrame[" << i << "][8]: " << pol->GxPassiveFrame[i] << std::endl;
  }
  ss << "GxPassiveStray[424]: " << pol->GxPassiveStray;
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatBasic[" << i << "][32]: " << pol->PstatBasic[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatTesting[" << i << "][8]: " << pol->PstatTesting[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatPartNumber[" << i << "][20]: " << pol->PstatPartNumber[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatAccessories[" << i << "][2]: " << pol->PstatAccessories[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatMarkerType[" << i << "][2]: " << pol->PstatMarkerType[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveBasic[" << i << "][32]: " << pol->PstatPassiveBasic[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveTesting[" << i << "][8]: " << pol->PstatPassiveTesting[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassivePartNumber[" << i << "][20]: " << pol->PstatPassivePartNumber[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveAccessories[" << i << "][2]: " << pol->PstatPassiveAccessories[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveMarkerType[" << i << "][2]: " << pol->PstatPassiveMarkerType[i] << std::endl;
  }
  ss << "SstatControl[2]: " << pol->SstatControl << std::endl;
  ss << "SstatSensor[2]: " << pol->SstatSensor << std::endl;
  ss << "SstatTiu[2]: " << pol->SstatTiu << std::endl;
  ss << "IrchkDetected: " << pol->IrchkDetected << std::endl;
  ss << "IrchkSources[128]: " << pol->IrchkSources << std::endl;
  ss << "PhrqReply[2]: " << pol->PhrqReply << std::endl;
  ss << "PhsrReply[1284]: " << pol->PhsrReply << std::endl;
  ss << "PhinfUnoccupied: " << pol->PhinfUnoccupied << std::endl;
  ss << "PhinfBasic[34]: " << pol->PhinfBasic << std::endl;
  ss << "PhinfTesting[8]: " << pol->PhinfTesting << std::endl;
  ss << "PhinfPartNumber[20]: " << pol->PhinfPartNumber << std::endl;
  ss << "PhinfAccessories[2]: " << pol->PhinfAccessories << std::endl;
  ss << "PhinfMarkerType[2]: " << pol->PhinfMarkerType << std::endl;
  ss << "PhinfPortLocation[14]: " << pol->PhinfPortLocation << std::endl;
  ss << "PhinfGpioStatus[2]: " << pol->PhinfGpioStatus << std::endl;
  ss << "TxHandleCount: " << pol->TxHandleCount << std::endl;
  ss << "TxHandles[NDI_MAX_HANDLES]: " << pol->TxHandles << std::endl;
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxTransforms[" << i << "][52]: " << pol->TxTransforms[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxStatus[" << i << "][8]: " << pol->TxStatus[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxFrame[" << i << "][8]: " << pol->TxFrame[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxInformation[" << i << "][12]: " << pol->TxInformation[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxSingleStray[" << i << "][24]: " << pol->TxSingleStray[i] << std::endl;
  }
  ss << "TxSystemStatus[4]: " << pol->TxSystemStatus << std::endl;
  ss << "TxPassiveStrayCount: " << pol->TxPassiveStrayCount << std::endl;
  ss << "TxPassiveStrayOov[14]: " << pol->TxPassiveStrayOov << std::endl;
  ss << "TxPassiveStray[1052]: " << pol->TxPassiveStray << std::endl;
  ss << "BxHandleCount: " << pol->BxHandleCount << std::endl;
  ss << "BxHandles[NDI_MAX_HANDLES]: " << pol->BxHandles << std::endl;
  ss << "BxHandlesStatus[NDI_MAX_HANDLES]: " << pol->BxHandlesStatus << std::endl;
  ss << "BxFrameNumber[NDI_MAX_HANDLES]: " << pol->BxFrameNumber << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxTransforms[" << i << "][8]: " << pol->BxTransforms[i] << std::endl;
  }
  ss << "BxPortStatus[NDI_MAX_HANDLES]: " << pol->BxPortStatus << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxToolMarkerInformation[" << i << "][11]: " << pol->BxToolMarkerInformation[i] << std::endl;
  }
  ss << "BxActiveSingleStrayMarkerStatus[NDI_MAX_HANDLES]: " << pol->BxActiveSingleStrayMarkerStatus << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxActiveSingleStrayMarkerPosition[" << i << "][3]: " << pol->BxActiveSingleStrayMarkerPosition[i] << std::endl;
  }
  ss << "Bx3DMarkerCount[NDI_MAX_HANDLES]: " << pol->Bx3DMarkerCount << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "Bx3DMarkerOutOfVolume[" << i << "][3]: " << pol->Bx3DMarkerOutOfVolume[i] << std::endl;
  }
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    for (int j = 0; j < pol->Bx3DMarkerCount[i]; j++)
    {
      ss << "Bx3DMarkerPosition[" << i << "][" << j << "][3]: " << pol->Bx3DMarkerPosition[i][j] << std::endl;
    }
  }
  ss << "BxPassiveStrayCount: " << pol->BxPassiveStrayCount << std::endl;
  ss << "BxPassiveStrayOutOfVolume[30]: " << pol->BxPassiveStrayOutOfVolume << std::endl;
  for (int i = 0; i < pol->BxPassiveStrayCount; ++i)
  {
    ss << "BxPassiveStrayPosition[" << i << "][3]: " << pol->BxPassiveStrayPosition[i] << std::endl;
  }

  assert(ss.str().size() < USHRT_MAX);
  strncpy(&outInformation[0], ss.str().c_str(), ss.str().size());
#else
  // Someone else can implement c style string building
#endif
}